

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O2

void __thiscall TorController::connected_cb(TorController *this,TorControlConnection *_conn)

{
  bool bVar1;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  _Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>
  local_78;
  ReplyHandlerCB local_60;
  allocator<char> local_39;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this->reconnect_timeout = 1.0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"PROTOCOLINFO 1",&local_39)
  ;
  local_78._M_f = (offset_in_TorController_to_subr)protocolinfo_cb;
  local_78._8_8_ = 0;
  local_78._M_bound_args.
  super__Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
  super__Head_base<0UL,_TorController_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)
       (_Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)this;
  std::function<void(TorControlConnection&,TorControlReply_const&)>::
  function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>,std::_Placeholder<2>))(TorControlConnection&,TorControlReply_const&)>,void>
            ((function<void(TorControlConnection&,TorControlReply_const&)> *)&local_60,&local_78);
  bVar1 = TorControlConnection::Command(_conn,&local_38,&local_60);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  std::__cxx11::string::~string((string *)&local_38);
  if (!bVar1) {
    logging_function._M_str = "connected_cb";
    logging_function._M_len = 0xc;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file._M_len = 0x57;
    ::LogPrintf_<>(logging_function,source_file,0x26e,ALL,Info,
                   "tor: Error sending initial protocolinfo command\n");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TorController::connected_cb(TorControlConnection& _conn)
{
    reconnect_timeout = RECONNECT_TIMEOUT_START;
    // First send a PROTOCOLINFO command to figure out what authentication is expected
    if (!_conn.Command("PROTOCOLINFO 1", std::bind(&TorController::protocolinfo_cb, this, std::placeholders::_1, std::placeholders::_2)))
        LogPrintf("tor: Error sending initial protocolinfo command\n");
}